

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O1

void __thiscall cppforth::Forth::mplus(Forth *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ForthStack<unsigned_int> *this_00;
  
  requireDStackDepth(this,3,"M+");
  this_00 = &this->dStack;
  uVar1 = ForthStack<unsigned_int>::getTop(this_00);
  uVar2 = ForthStack<unsigned_int>::getTop(this_00,2);
  uVar3 = ForthStack<unsigned_int>::getTop(this_00,1);
  ForthStack<unsigned_int>::pop(this_00);
  ForthStack<unsigned_int>::setTop(this_00,1,(uint)((long)(int)uVar1 + (ulong)uVar2));
  ForthStack<unsigned_int>::setTop(this_00,0,(int)((long)(int)uVar1 + (ulong)uVar2 >> 0x20) + uVar3)
  ;
  return;
}

Assistant:

void mplus(){
			REQUIRE_DSTACK_DEPTH(3, "M+");
			SCell n(dStack.getTop());
			DCell d1(dStack.getTop(2), dStack.getTop(1));
			dStack.pop();
			d1.data_.Dcells = d1.data_.Dcells+n;
			dStack.setTop(1, d1.data_.Cells.lo);
			dStack.setTop(0, d1.data_.Cells.hi);
		}